

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O2

void __thiscall
dg::llvmdg::LazyLLVMCallGraph::_populateCalledFunctions(LazyLLVMCallGraph *this,Function *fun)

{
  Function *pFVar1;
  Function *pFVar2;
  Function *pFVar3;
  
  for (pFVar3 = fun + 0x50; pFVar3 = *(Function **)pFVar3, pFVar3 != fun + 0x48; pFVar3 = pFVar3 + 8
      ) {
    pFVar1 = pFVar3 + -0x18;
    if (pFVar3 == (Function *)0x0) {
      pFVar1 = (Function *)0x0;
    }
    for (pFVar2 = pFVar1 + 0x30; pFVar2 = *(Function **)pFVar2, pFVar2 != pFVar1 + 0x28;
        pFVar2 = pFVar2 + 8) {
      if ((pFVar2 != (Function *)0x0) && (pFVar2[-8] == (Function)0x53)) {
        getCalledFunctions(this,(CallInst *)(pFVar2 + -0x18));
      }
    }
  }
  return;
}

Assistant:

void _populateCalledFunctions(const llvm::Function *fun) {
        for (auto &B : *fun) {
            for (auto &I : B) {
                if (auto *C = llvm::dyn_cast<llvm::CallInst>(&I)) {
                    getCalledFunctions(C);
                }
            }
        }
    }